

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode set_local_ip(Curl_cfilter *cf,Curl_easy *data)

{
  uint err;
  void *pvVar1;
  _Bool _Var2;
  int iVar3;
  undefined7 extraout_var;
  uint *puVar5;
  char *pcVar6;
  Curl_handler *extraout_RAX;
  char *fmt;
  curl_socklen_t slen;
  Curl_sockaddr_storage ssloc;
  char buffer [256];
  socklen_t local_19c;
  sockaddr local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  char local_118 [256];
  Curl_handler *pCVar4;
  
  pCVar4 = data->conn->handler;
  if ((pCVar4->protocol & 0x800) == 0) {
    pvVar1 = cf->ctx;
    local_19c = 0x80;
    local_198.sa_family = 0;
    local_198.sa_data[0] = '\0';
    local_198.sa_data[1] = '\0';
    local_198.sa_data[2] = '\0';
    local_198.sa_data[3] = '\0';
    local_198.sa_data[4] = '\0';
    local_198.sa_data[5] = '\0';
    local_198.sa_data[6] = '\0';
    local_198.sa_data[7] = '\0';
    local_198.sa_data[8] = '\0';
    local_198.sa_data[9] = '\0';
    local_198.sa_data[10] = '\0';
    local_198.sa_data[0xb] = '\0';
    local_198.sa_data[0xc] = '\0';
    local_198.sa_data[0xd] = '\0';
    local_188 = 0;
    uStack_180 = 0;
    local_178 = 0;
    uStack_170 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_138 = 0;
    uStack_130 = 0;
    local_128 = 0;
    uStack_120 = 0;
    iVar3 = getsockname(*(int *)((long)pvVar1 + 0x98),&local_198,&local_19c);
    if (iVar3 == 0) {
      _Var2 = Curl_addr2string((sockaddr *)&local_198,local_19c,(char *)((long)pvVar1 + 0x114),
                               (int *)((long)pvVar1 + 0x144));
      pCVar4 = (Curl_handler *)CONCAT71(extraout_var,_Var2);
      if (_Var2) goto LAB_00586d51;
      fmt = "ssloc inet_ntop() failed with errno %d: %s";
    }
    else {
      fmt = "getsockname() failed with errno %d: %s";
    }
    puVar5 = (uint *)__errno_location();
    err = *puVar5;
    pcVar6 = Curl_strerror(err,local_118,0x100);
    Curl_failf(data,fmt,(ulong)err,pcVar6);
    pCVar4 = extraout_RAX;
  }
LAB_00586d51:
  return (CURLcode)pCVar4;
}

Assistant:

static CURLcode set_local_ip(struct Curl_cfilter *cf,
                             struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;

#ifdef HAVE_GETSOCKNAME
  if(!(data->conn->handler->protocol & CURLPROTO_TFTP)) {
    /* TFTP does not connect, so it cannot get the IP like this */

    char buffer[STRERROR_LEN];
    struct Curl_sockaddr_storage ssloc;
    curl_socklen_t slen = sizeof(struct Curl_sockaddr_storage);

    memset(&ssloc, 0, sizeof(ssloc));
    if(getsockname(ctx->sock, (struct sockaddr*) &ssloc, &slen)) {
      int error = SOCKERRNO;
      failf(data, "getsockname() failed with errno %d: %s",
            error, Curl_strerror(error, buffer, sizeof(buffer)));
      return CURLE_FAILED_INIT;
    }
    if(!Curl_addr2string((struct sockaddr*)&ssloc, slen,
                         ctx->l_ip, &ctx->l_port)) {
      failf(data, "ssloc inet_ntop() failed with errno %d: %s",
            errno, Curl_strerror(errno, buffer, sizeof(buffer)));
      return CURLE_FAILED_INIT;
    }
  }
#else
  (void)data;
  ctx->l_ip[0] = 0;
  ctx->l_port = -1;
#endif
  return CURLE_OK;
}